

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_reporting.cpp
# Opt level: O3

void __thiscall
pstore::http::report_error
          (http *this,error_code error,request_info *request,socket_descriptor *socket)

{
  long lVar1;
  undefined8 *puVar2;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> rVar3;
  socket_descriptor *socket_00;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  error_category *peVar6;
  error_code *peVar7;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> *prVar8;
  request_info *prVar9;
  error_category *peVar10;
  int iVar11;
  error_category *peVar12;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar13;
  long *in_FS_OFFSET;
  error_code eVar14;
  string h;
  string response_string;
  array<std::pair<const_char_*,_const_char_*>,_1UL> headers;
  ostringstream message;
  czstring in_stack_fffffffffffffd60;
  anon_union_16_2_eb5a95ea_for_error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>_1
  local_298;
  char local_288;
  undefined7 uStack_287;
  request_info *local_278;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_270;
  string local_258;
  error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&> local_238;
  request_info *local_220 [2];
  undefined1 local_210 [16];
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_200;
  char *local_1e8;
  undefined1 local_1e0 [8];
  pair<const_char_*,_const_char_*> local_1d8;
  extent_type<_1L> local_1c8 [2];
  char local_1b8 [96];
  ios_base local_158 [264];
  span<const_unsigned_char,__1L> local_50;
  span<const_unsigned_char,__1L> local_40;
  
  peVar10 = error._M_cat;
  peVar12 = error._0_8_;
  iVar11 = (int)this;
  local_278 = request;
  (**(code **)(*(long *)peVar12 + 0x20))(local_220,peVar12,(ulong)this & 0xffffffff);
  pstore::details::log_destinations::__tls_init();
  lVar1 = *in_FS_OFFSET;
  if (*(long *)(lVar1 + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar13 = *(undefined8 **)(lVar1 + -8);
    puVar2 = (undefined8 *)puVar13[1];
    prVar9 = local_220[0];
    for (puVar13 = (undefined8 *)*puVar13; local_220[0] = prVar9, puVar13 != puVar2;
        puVar13 = puVar13 + 1) {
      (**(code **)(*(long *)*puVar13 + 0x50))((long *)*puVar13,3,"http error: ");
      request = prVar9;
      prVar9 = local_220[0];
    }
  }
  if (local_220[0] != (request_info *)local_210) {
    operator_delete(local_220[0],(ulong)(local_210._0_8_ + 1));
  }
  peVar6 = get_error_category();
  if (peVar6 == peVar12) {
    if (iVar11 == 1) {
      rVar3._M_data = *(descriptor<pstore::details::posix_descriptor_traits> **)(peVar10 + 0x20);
      (**(code **)(*(long *)peVar12 + 0x20))(local_1c8,peVar12,1);
      send_error_page<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                  *)&local_298,(http *)net::network_sender,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)local_278,rVar3,(czstring)0x190,0x126659,(czstring)local_1c8[0].size_,
                 in_stack_fffffffffffffd60);
    }
    else {
      if (iVar11 == 2) {
        build_status_line_abi_cxx11_(&local_258,(http *)0x1aa,0x125a23,(czstring)request);
        _Var5._M_p = local_258._M_dataplus._M_p;
        pstore::gsl::details::extent_type<-1L>::extent_type(local_1c8,local_258._M_string_length);
        pstore::gsl::details::extent_type<-1L>::extent_type(local_1c8,local_1c8[0].size_);
        local_50.storage_.super_extent_type<_1L>.size_ = local_1c8[0].size_;
        local_50.storage_.data_ = (pointer)_Var5._M_p;
        net::network_sender(&local_238,(socket_descriptor *)local_278,&local_50);
        if (local_238.has_error_ == false) {
          prVar8 = error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>
                   ::
                   value_storage_impl<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                             (&local_238);
          socket_00 = prVar8->_M_data;
          local_1c8[0].size_ = (index_type)local_1b8;
          std::__cxx11::string::_M_construct((ulong)local_1c8,'\x02');
          *(undefined2 *)local_1c8[0].size_ = 0x3331;
          local_1e8 = "Sec-WebSocket-Version";
          local_1e0 = (undefined1  [8])local_1c8[0].size_;
          build_headers<std::pair<char_const*,char_const*>const*,void>
                    ((string *)&local_298,(http *)&local_1e8,
                     (pair<const_char_*,_const_char_*> *)(local_1e0 + 8),
                     (pair<const_char_*,_const_char_*> *)"Sec-WebSocket-Version");
          uVar4 = local_298.storage_;
          pstore::gsl::details::extent_type<-1L>::extent_type
                    ((extent_type<_1L> *)(local_1e0 + 8),local_298._8_8_);
          pstore::gsl::details::extent_type<-1L>::extent_type
                    ((extent_type<_1L> *)(local_1e0 + 8),(index_type)local_1d8.first);
          local_40.storage_.super_extent_type<_1L>.size_ = (index_type)local_1d8.first;
          local_40.storage_.data_ = (pointer)uVar4;
          net::network_sender((error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>
                               *)&local_270,socket_00,&local_40);
          if (local_298.storage_ != (type)&local_288) {
            operator_delete((void *)local_298.storage_,CONCAT71(uStack_287,local_288) + 1);
          }
          if ((char *)local_1c8[0].size_ != local_1b8) {
            operator_delete((void *)local_1c8[0].size_,local_1b8._0_8_ + 1);
          }
        }
        else {
          eVar14 = error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>
                   ::get_error(&local_238);
          local_270.has_error_ = true;
          peVar7 = error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>
                   ::
                   error_storage_impl<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>&,std::error_code>
                             ((error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>
                               *)&local_270);
          peVar7->_M_value = eVar14._M_value;
          peVar7->_M_cat = eVar14._M_cat;
        }
        local_200.has_error_ = true;
        error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
        ::move_construct<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>
                  ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                    *)(local_210 + 0x10),
                   (error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>
                    *)&local_270);
        if (local_270.has_error_ == false) {
          error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>::
          value_storage_impl<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                    ((error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>
                      *)&local_270);
        }
        else {
          error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>::
          error_storage_impl<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>&,std::error_code>
                    ((error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>
                      *)&local_270);
        }
        if (local_238.has_error_ == false) {
          error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>::
          value_storage_impl<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                    (&local_238);
        }
        else {
          error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>::
          error_storage_impl<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>&,std::error_code>
                    (&local_238);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_200.has_error_ != false) {
          error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          ::
          error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
                    ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                      *)(local_210 + 0x10));
          return;
        }
        error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
        ::
        value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                  ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                    *)(local_210 + 0x10));
        return;
      }
      if (iVar11 != 3) goto LAB_00116b8a;
      rVar3._M_data = *(descriptor<pstore::details::posix_descriptor_traits> **)(peVar10 + 0x20);
      (**(code **)(*(long *)peVar12 + 0x20))(local_1c8,peVar12,3);
      send_error_page<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                  *)&local_298,(http *)net::network_sender,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)local_278,rVar3,(czstring)0x1f5,0x126685,(czstring)local_1c8[0].size_,
                 in_stack_fffffffffffffd60);
    }
  }
  else {
    peVar6 = &romfs::get_romfs_error_category()->super_error_category;
    if ((peVar6 != peVar12) || ((iVar11 != 0x14 && (iVar11 != 2)))) {
LAB_00116b8a:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Server internal error: ",0x17);
      (**(code **)(*(long *)peVar12 + 0x20))(&local_298,peVar12,(ulong)this & 0xffffffff);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,(char *)local_298.storage_,local_298._8_8_);
      if (local_298.storage_ != (type)&local_288) {
        operator_delete((void *)local_298.storage_,CONCAT71(uStack_287,local_288) + 1);
      }
      std::__cxx11::stringbuf::str();
      _Var5._M_p = local_258._M_dataplus._M_p;
      rVar3._M_data = *(descriptor<pstore::details::posix_descriptor_traits> **)(peVar10 + 0x20);
      (**(code **)(*(long *)peVar12 + 0x20))(&local_298,peVar12,(ulong)this & 0xffffffff);
      send_error_page<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_270,(http *)net::network_sender,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)local_278,rVar3,(czstring)0x1f4,(http_status_code)_Var5._M_p,
                 (czstring)local_298.storage_,in_stack_fffffffffffffd60);
      if (local_270.has_error_ == false) {
        error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
        ::
        value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                  (&local_270);
      }
      else {
        error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
        ::
        error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
                  (&local_270);
      }
      if (local_298.storage_ != (type)&local_288) {
        operator_delete((void *)local_298.storage_,CONCAT71(uStack_287,local_288) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      return;
    }
    rVar3._M_data = *(descriptor<pstore::details::posix_descriptor_traits> **)(peVar10 + 0x20);
    (**(code **)(*(long *)peVar12 + 0x20))(local_1c8,peVar12,(ulong)this & 0xffffffff);
    send_error_page<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                *)&local_298,(http *)net::network_sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)local_278,rVar3,(czstring)0x194,0x1266f6,(czstring)local_1c8[0].size_,
               in_stack_fffffffffffffd60);
  }
  if (local_288 == '\0') {
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                *)&local_298);
  }
  else {
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
              ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                *)&local_298);
  }
  if ((char *)local_1c8[0].size_ != local_1b8) {
    operator_delete((void *)local_1c8[0].size_,local_1b8._0_8_ + 1);
  }
  return;
}

Assistant:

void report_error (std::error_code const error, request_info const & request,
                           socket_descriptor & socket) {
            static constexpr auto sender = net::network_sender;

            auto const report = [&] (http_status_code const code, gsl::czstring const message) {
                send_error_page (sender, std::ref (socket), request.uri ().c_str (), code, message,
                                 error.message ().c_str ());
            };

            log (logger::priority::error, "http error: ", error.message ());
            auto const & cat = error.category ();
            if (cat == get_error_category ()) {
                switch (static_cast<error_code> (error.value ())) {
                case error_code::bad_request:
                    return report (http_status_code::bad_request, "Bad request");

                case error_code::bad_websocket_version:
                    send_bad_websocket_version (sender, std::ref (socket));
                    return;

                case error_code::not_implemented:
                    return report (http_status_code::not_implemented, "Not implemented");

                case error_code::string_too_long:
                case error_code::refill_out_of_range: break;
                }
            } else if (cat == romfs::get_romfs_error_category ()) {
                switch (static_cast<romfs::error_code> (error.value ())) {
                case romfs::error_code::enoent:
                case romfs::error_code::enotdir:
                    return report (http_status_code::not_found, "Not found");

                case romfs::error_code::einval: break;
                }
            }

            // Some error that we don't know how to report properly.
            std::ostringstream message;
            message << "Server internal error: " << error.message ();
            report (http_status_code::internal_server_error, message.str ().c_str ());
        }